

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::is_enabled(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_INVALID_ENUM is generated if cap is not an accepted value.",
             &local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glIsEnabled(&local_10->super_CallLogWrapper,0xffffffff);
  NegativeTestContext::expectError(local_10,0x500);
  glu::CallLogWrapper::glIsEnabled(&local_10->super_CallLogWrapper,4);
  NegativeTestContext::expectError(local_10,0x500);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void is_enabled (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if cap is not an accepted value.");
	ctx.glIsEnabled(-1);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.glIsEnabled(GL_TRIANGLES);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}